

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

void validate_symmetric_distances(Instance *instance)

{
  int iVar1;
  int j;
  int i;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = instance->num_customers;
  if (-1 < iVar1) {
    i = 0;
    do {
      j = 0;
      do {
        dVar3 = cptp_dist(instance,i,j);
        dVar4 = cptp_dist(instance,j,i);
        if (1e-05 < ABS(dVar3 - dVar4)) {
          __assert_fail("feq(d1, d2, 1e-5)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                        ,0x24,"void validate_symmetric_distances(const Instance *)");
        }
        j = j + 1;
      } while (iVar1 + 1 != j);
      bVar2 = i != iVar1;
      i = i + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void validate_symmetric_distances(const Instance *instance) {
#ifndef NDEBUG
    const int32_t n = instance->num_customers + 1;

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            double d1 = cptp_dist(instance, i, j);
            double d2 = cptp_dist(instance, j, i);
            assert(feq(d1, d2, 1e-5));
        }
    }
#else
    UNUSED_PARAM(instance);
#endif
}